

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  uint uVar1;
  byte bVar2;
  pointer phVar3;
  pointer phVar4;
  
  while( true ) {
    bVar2 = (byte)(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
                  extra_;
    uVar1 = bVar2 & 0xf;
    if (1 < uVar1 - 8) break;
    this = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
            &(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
             field_0x8;
  }
  if (0xf < uVar1) {
    return false;
  }
  if ((0x6cU >> uVar1 & 1) != 0) {
    return true;
  }
  if ((0x8080U >> uVar1 & 1) != 0) {
    bVar2 = bVar2 & 0xe;
    phVar3 = (pointer)this;
    phVar4 = (pointer)this;
    if (bVar2 == 8) {
      do {
        phVar3 = (((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                    *)&phVar3->super_heap_string_base<unsigned_long,_std::allocator<char>_>)->
                 byte_str_).ptr_;
      } while (((phVar3->super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ & 0xe)
               == 8);
      if (*(char *)((long)&(phVar3->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
                           extra_ + 1) == '\x02') {
        return true;
      }
      do {
        phVar4 = (((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                    *)&phVar4->super_heap_string_base<unsigned_long,_std::allocator<char>_>)->
                 byte_str_).ptr_;
      } while (((phVar4->super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ & 0xe)
               == 8);
    }
    else if (*(char *)((long)&(((pointer)this)->
                              super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ +
                      1) == '\x02') {
      return true;
    }
    if ((((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
           *)&phVar4->super_heap_string_base<unsigned_long,_std::allocator<char>_>)->common_).tag_
        == bigdec) {
      return true;
    }
    while (bVar2 == 8) {
      this = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
              &(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
               field_0x8;
      bVar2 = (byte)(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
                    extra_ & 0xe;
    }
    return *(char *)((long)&(((pointer)this)->
                            super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ + 1
                    ) == '\n';
  }
  return false;
}

Assistant:

bool is_number() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::int64:
                case json_storage_kind::uint64:
                case json_storage_kind::half_float:
                case json_storage_kind::float64:
                    return true;
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                    return tag() == semantic_tag::bigint ||
                           tag() == semantic_tag::bigdec ||
                           tag() == semantic_tag::bigfloat;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_number();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_number();
                default:
                    return false;
            }
        }